

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino.c
# Opt level: O1

void response_header_set(DHANDLE dhandle,char *key,char *value)

{
  int line;
  long lVar1;
  char *template;
  
  if ((dhandle == (DHANDLE)0x0) || (*dhandle != 2)) {
    lVar1 = 0;
  }
  else {
    lVar1 = (long)dhandle + 0x30;
  }
  if (lVar1 == 0) {
    template = "Response is NULL...";
    line = 0x189;
  }
  else {
    if ((key != (char *)0x0) && (*key != '\0')) {
      dino_strmap_add(*(str_map_t **)(lVar1 + 8),key,value);
      return;
    }
    template = "Invalid key, must have at least one character...";
    line = 0x186;
  }
  log_message(3,"response_header_set",
              "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/lib/dino.c"
              ,line,template);
  return;
}

Assistant:

void DINO_EXPORT response_header_set(DHANDLE dhandle, const char *key, const char *value) {
    dino_http_response_t *response = cast_dhandle_response(dhandle);

    if (NULL != response) {
        if (key && *key) {
            dino_strmap_add(response->params_map, key, value);
        } else {
            log_message(LOG_ERR, __FUNCTION__, __FILE__, __LINE__, "Invalid key, must have at least one character...");
        }
    } else {
        log_message(LOG_ERR, __FUNCTION__, __FILE__, __LINE__, "Response is NULL...");
    }
}